

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O1

void __thiscall
vkt::sr::anon_unknown_0::IndexingTestUniformSetup::setup
          (IndexingTestUniformSetup *this,ShaderRenderCaseInstance *instance,Vec4 *constCoords)

{
  float fVar1;
  pointer pcVar2;
  pointer pcVar3;
  int i;
  long lVar4;
  TestError *this_00;
  Vector<float,_4> res_3;
  Vector<float,_3> res_2;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  char local_b8 [24];
  float local_a0 [2];
  pointer local_98;
  ulong uStack_90;
  pointer local_88;
  ulong uStack_80;
  pointer local_78;
  ulong uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  pointer local_50;
  uint local_48;
  pointer local_40;
  uint local_38;
  pointer local_30;
  uint local_28;
  
  ShaderRenderCaseInstance::useUniform(instance,0,UI_ZERO);
  ShaderRenderCaseInstance::useUniform(instance,1,UI_ONE);
  ShaderRenderCaseInstance::useUniform(instance,2,UI_TWO);
  ShaderRenderCaseInstance::useUniform(instance,3,UI_THREE);
  ShaderRenderCaseInstance::useUniform(instance,4,UI_FOUR);
  if (this->m_usesArray != true) {
    return;
  }
  local_68 = (pointer)0x0;
  uStack_60 = 0;
  local_78 = (pointer)0x0;
  uStack_70 = 0;
  local_88 = (pointer)0x0;
  uStack_80 = 0;
  local_98 = (pointer)0x0;
  uStack_90 = 0;
  switch(this->m_varType) {
  case TYPE_FLOAT:
    fVar1 = constCoords->m_data[0];
    lVar4 = 0;
    do {
      *(float *)(local_c8 + lVar4 * 4) = fVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    local_98 = (pointer)local_c8;
    uStack_90 = uStack_c0;
    lVar4 = 0;
    do {
      *(float *)(local_c8 + lVar4 * 4) = fVar1 * 0.5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    local_88 = (pointer)local_c8;
    uStack_80 = uStack_c0;
    lVar4 = 0;
    do {
      *(float *)(local_c8 + lVar4 * 4) = fVar1 * 0.25;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    local_78 = (pointer)local_c8;
    uStack_70 = uStack_c0;
    lVar4 = 0;
    do {
      *(float *)(local_c8 + lVar4 * 4) = fVar1 * 0.125;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    break;
  case TYPE_FLOAT_VEC2:
    local_a0[0] = constCoords->m_data[0];
    local_a0[1] = constCoords->m_data[1];
    local_98 = *(pointer *)constCoords->m_data;
    lVar4 = 0;
    uStack_90 = 0;
    local_c8 = (undefined1  [8])0x0;
    do {
      *(float *)(local_c8 + lVar4 * 4) = local_a0[lVar4] * 0.5;
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    local_88 = (pointer)local_c8;
    lVar4 = 0;
    uStack_80 = 0;
    local_c8 = (undefined1  [8])0x0;
    do {
      *(float *)(local_c8 + lVar4 * 4) = local_a0[lVar4] * 0.25;
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    local_78 = (pointer)local_c8;
    lVar4 = 0;
    uStack_70 = 0;
    local_c8 = (undefined1  [8])0x0;
    do {
      *(float *)(local_c8 + lVar4 * 4) = local_a0[lVar4] * 0.125;
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    local_68 = (pointer)local_c8;
    uStack_60 = 0;
    goto LAB_005b3b05;
  case TYPE_FLOAT_VEC3:
    pcVar3 = *(pointer *)constCoords->m_data;
    pcVar2 = *(pointer *)constCoords->m_data;
    local_98 = *(pointer *)constCoords->m_data;
    fVar1 = constCoords->m_data[2];
    lVar4 = 0;
    uStack_90 = (ulong)(uint)fVar1;
    local_c8 = (undefined1  [8])*(pointer *)constCoords->m_data;
    uStack_c0._0_4_ = fVar1;
    local_28 = 0;
    local_30 = (pointer)0x0;
    do {
      *(float *)((long)&local_30 + lVar4 * 4) = *(float *)(local_c8 + lVar4 * 4) * 0.5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_88 = local_30;
    lVar4 = 0;
    uStack_80 = (ulong)local_28;
    local_c8 = (undefined1  [8])pcVar2;
    local_38 = 0;
    local_40 = (pointer)0x0;
    do {
      *(float *)((long)&local_40 + lVar4 * 4) = *(float *)(local_c8 + lVar4 * 4) * 0.25;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_78 = local_40;
    lVar4 = 0;
    uStack_70 = (ulong)local_38;
    local_c8 = (undefined1  [8])pcVar3;
    uStack_c0 = CONCAT44(uStack_c0._4_4_,fVar1);
    local_48 = 0;
    local_50 = (pointer)0x0;
    do {
      *(float *)((long)&local_50 + lVar4 * 4) = *(float *)(local_c8 + lVar4 * 4) * 0.125;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_68 = local_50;
    uStack_60 = (ulong)local_48;
    goto LAB_005b3b05;
  case TYPE_FLOAT_VEC4:
    local_98 = *(pointer *)constCoords->m_data;
    uStack_90 = *(ulong *)(constCoords->m_data + 2);
    local_c8 = (undefined1  [8])0x0;
    uStack_c0 = 0;
    lVar4 = 0;
    do {
      *(float *)(local_c8 + lVar4 * 4) = constCoords->m_data[lVar4] * 0.5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    local_88 = (pointer)local_c8;
    uStack_80 = uStack_c0;
    local_c8 = (undefined1  [8])0x0;
    uStack_c0 = 0;
    lVar4 = 0;
    do {
      *(float *)(local_c8 + lVar4 * 4) = constCoords->m_data[lVar4] * 0.25;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    local_78 = (pointer)local_c8;
    uStack_70 = uStack_c0;
    local_c8 = (undefined1  [8])0x0;
    uStack_c0 = 0;
    lVar4 = 0;
    do {
      *(float *)(local_c8 + lVar4 * 4) = constCoords->m_data[lVar4] * 0.125;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    local_c8 = (undefined1  [8])local_b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c8,"invalid data type for u_arr","");
    tcu::TestError::TestError(this_00,(string *)local_c8);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_68 = (pointer)CONCAT44(local_c8._4_4_,local_c8._0_4_);
  uStack_60 = CONCAT44(uStack_c0._4_4_,(float)uStack_c0);
LAB_005b3b05:
  ShaderRenderCaseInstance::addUniform(instance,5,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x40,&local_98);
  return;
}

Assistant:

void IndexingTestUniformSetup::setup (ShaderRenderCaseInstance& instance, const tcu::Vec4& constCoords) const
{
	instance.useUniform(0u, UI_ZERO);
	instance.useUniform(1u, UI_ONE);
	instance.useUniform(2u, UI_TWO);
	instance.useUniform(3u, UI_THREE);
	instance.useUniform(4u, UI_FOUR);

	if (m_usesArray)
	{
		Vec4 arr[4];
		if (m_varType == TYPE_FLOAT)
		{
			arr[0] = Vec4(constCoords.x());
			arr[1] = Vec4(constCoords.x() * 0.5f);
			arr[2] = Vec4(constCoords.x() * 0.25f);
			arr[3] = Vec4(constCoords.x() * 0.125f);
		}
		else if (m_varType == TYPE_FLOAT_VEC2)
		{
			arr[0] = constCoords.swizzle(0, 1).toWidth<4>();
			arr[1] = (constCoords.swizzle(0, 1) * 0.5f).toWidth<4>();
			arr[2] = (constCoords.swizzle(0, 1) * 0.25f).toWidth<4>();
			arr[3] = (constCoords.swizzle(0, 1) * 0.125f).toWidth<4>();
		}
		else if (m_varType == TYPE_FLOAT_VEC3)
		{
			arr[0] = constCoords.swizzle(0, 1, 2).toWidth<4>();
			arr[1] = (constCoords.swizzle(0, 1, 2) * 0.5f).toWidth<4>();
			arr[2] = (constCoords.swizzle(0, 1, 2) * 0.25f).toWidth<4>();
			arr[3] = (constCoords.swizzle(0, 1, 2) * 0.125f).toWidth<4>();
		}
		else if (m_varType == TYPE_FLOAT_VEC4)
		{
			arr[0] = constCoords;
			arr[1] = constCoords * 0.5f;
			arr[2] = constCoords * 0.25f;
			arr[3] = constCoords * 0.125f;
		}
		else
			throw tcu::TestError("invalid data type for u_arr");

			instance.addUniform(5u, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, sizeof(Vec4) * 4, arr[0].getPtr());
	}
}